

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O2

void __thiscall
sglr::Context::texImage2D
          (Context *this,deUint32 target,int level,deUint32 internalFormat,Surface *src)

{
  uint uVar1;
  uint uVar2;
  ConstPixelBufferAccess CStack_58;
  
  uVar1 = src->m_width;
  uVar2 = src->m_height;
  tcu::Surface::getAccess(&CStack_58,src);
  (*this->_vptr_Context[0x11])
            (this,(ulong)target,(ulong)(uint)level,(ulong)internalFormat,(ulong)uVar1,(ulong)uVar2,0
             ,0x1908,0x1401,CStack_58.m_data);
  return;
}

Assistant:

void Context::texImage2D (deUint32 target, int level, deUint32 internalFormat, const tcu::Surface& src)
{
	int		width	= src.getWidth();
	int		height	= src.getHeight();
	texImage2D(target, level, internalFormat, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, src.getAccess().getDataPtr());
}